

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O2

void __thiscall
amrex::MLABecLaplacian::Fapply
          (MLABecLaplacian *this,int amrlev,int mglev,MultiFab *out,MultiFab *in)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  FabArray<amrex::IArrayBox> *this_00;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  int local_45c;
  Box local_334;
  Real local_318;
  ulong local_310;
  long local_308;
  ulong local_300;
  FabArray<amrex::FArrayBox> *local_2f8;
  FabArray<amrex::FArrayBox> *local_2f0;
  FabArray<amrex::FArrayBox> *local_2e8;
  FabArray<amrex::FArrayBox> *local_2e0;
  FabArray<amrex::FArrayBox> *local_2d8;
  long local_2d0;
  long local_2c8;
  MLABecLaplacian *local_2c0;
  FabArray<amrex::FArrayBox> *local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  Array4<const_double> local_288;
  Array4<const_double> local_248;
  Array4<const_double> local_208;
  Array4<double> local_1c8;
  Array4<const_double> local_188;
  Array4<const_double> local_148;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  Array4<const_int> local_d0;
  MFIter mfi;
  
  lVar8 = (long)amrlev;
  local_2c8 = lVar8 * 0x18;
  local_2d0 = (long)mglev;
  local_2d8 = (FabArray<amrex::FArrayBox> *)
              (local_2d0 * 0x180 +
              *(long *)&(this->m_a_coeffs).
                        super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar8].
                        super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                        super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>);
  lVar10 = *(long *)&(this->m_b_coeffs).
                     super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar8].
                     super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     .
                     super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  local_2e8 = (FabArray<amrex::FArrayBox> *)(lVar10 + local_2d0 * 0x480);
  local_2f0 = local_2e8 + 1;
  local_2f8 = (FabArray<amrex::FArrayBox> *)(lVar10 + 0x300 + local_2d0 * 0x480);
  lVar10 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar8].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar8 = local_2d0 * 200;
  dVar2 = *(double *)(lVar10 + 0x38 + lVar8);
  dVar3 = *(double *)(lVar10 + 0x40 + lVar8);
  dVar4 = *(double *)(lVar10 + 0x48 + lVar8);
  local_318 = this->m_a_scalar;
  dVar5 = this->m_b_scalar;
  local_2c0 = this;
  local_2b8 = &in->super_FabArray<amrex::FArrayBox>;
  uVar6 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  local_2e0 = &out->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&mfi,(FabArrayBase *)out,true);
  uStack_f0 = 0x8000000000000000;
  local_f8 = -dVar2 * dVar5 * dVar2;
  uStack_100 = 0x8000000000000000;
  local_108 = -dVar3 * dVar5 * dVar3;
  uStack_e0 = 0x8000000000000000;
  local_e8 = -dVar4 * dVar5 * dVar4;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  local_310 = (ulong)uVar6;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&local_334,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_188,local_2b8,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_1c8,local_2e0,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_148,local_2d8,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_208,local_2e8,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_248,local_2f0,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_288,local_2f8,&mfi);
    this_00 = *(FabArray<amrex::IArrayBox> **)
               (*(long *)((long)&(((local_2c0->super_MLCellABecLap).m_overset_mask.
                                   super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                   .
                                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                 ).
                                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_2c8) +
               local_2d0 * 8);
    if (this_00 == (FabArray<amrex::IArrayBox> *)0x0) {
      local_2a0 = (long)local_334.smallend.vect[1];
      local_2b0 = (long)local_334.smallend.vect[2];
      local_290 = (long)local_334.bigend.vect[1];
      local_2a8 = (long)local_334.smallend.vect[0] * 8;
      local_308 = 0;
      for (local_300 = 0; lVar10 = local_2b0, local_45c = local_334.smallend.vect[2] + -1,
          iVar7 = local_334.smallend.vect[2], local_300 != local_310; local_300 = local_300 + 1) {
        while( true ) {
          iVar7 = iVar7 + 1;
          if (local_334.bigend.vect[2] < (int)lVar10) break;
          lVar14 = (long)local_188.begin.x;
          lVar13 = local_188.kstride * 8;
          lVar11 = local_188.nstride * local_308;
          lVar1 = (lVar10 - local_188.begin.z) * lVar13 + lVar11 + lVar14 * -8 + local_2a8;
          lVar23 = local_248.nstride * local_308 +
                   (lVar10 - local_248.begin.z) * local_248.kstride * 8 +
                   (long)local_248.begin.x * -8 + local_2a8;
          local_298 = lVar10 + 1;
          lVar8 = local_188.jstride * 8;
          lVar9 = local_2a0;
          while (lVar9 <= local_290) {
            if (local_334.bigend.vect[0] < local_334.smallend.vect[0]) {
              lVar9 = lVar9 + 1;
            }
            else {
              lVar17 = lVar9 - local_148.begin.y;
              lVar19 = lVar9 - local_188.begin.y;
              lVar16 = (lVar9 - local_208.begin.y) * local_208.jstride * 8 +
                       local_208.nstride * local_308 +
                       (lVar10 - local_208.begin.z) * local_208.kstride * 8 +
                       (long)local_208.begin.x * -8 + local_2a8;
              lVar15 = lVar9 + 1;
              lVar22 = lVar9 - local_248.begin.y;
              iVar12 = (int)lVar9;
              lVar26 = (lVar9 - local_288.begin.y) * local_288.jstride * 8;
              lVar18 = lVar9 - local_1c8.begin.y;
              lVar20 = lVar19 * lVar8;
              lVar24 = 0;
              do {
                dVar2 = *(double *)((long)local_188.p + lVar24 * 8 + lVar20 + lVar1);
                *(double *)
                 ((long)local_1c8.p +
                 lVar24 * 8 +
                 lVar18 * local_1c8.jstride * 8 +
                 local_1c8.nstride * local_308 +
                 (lVar10 - local_1c8.begin.z) * local_1c8.kstride * 8 + (long)local_1c8.begin.x * -8
                 + local_2a8) =
                     ((*(double *)
                        ((long)local_188.p +
                        lVar24 * 8 +
                        lVar20 + ((long)iVar7 - (long)local_188.begin.z) * lVar13 + lVar11 +
                                 lVar14 * -8 + local_2a8) - dVar2) *
                      *(double *)
                       ((long)local_288.p +
                       lVar24 * 8 +
                       lVar26 + ((long)iVar7 - (long)local_288.begin.z) * local_288.kstride * 8 +
                                local_288.nstride * local_308 + (long)local_288.begin.x * -8 +
                                local_2a8) -
                     (dVar2 - *(double *)
                               ((long)local_188.p +
                               lVar24 * 8 +
                               lVar20 + (local_45c - local_188.begin.z) * lVar13 + lVar11 +
                                        lVar14 * -8 + local_2a8)) *
                     *(double *)
                      ((long)local_288.p +
                      lVar24 * 8 +
                      lVar26 + (lVar10 - local_288.begin.z) * local_288.kstride * 8 +
                               local_288.nstride * local_308 + (long)local_288.begin.x * -8 +
                               local_2a8)) * local_e8 +
                     ((*(double *)
                        ((long)local_188.p +
                        lVar24 * 8 + (lVar15 - local_188.begin.y) * lVar8 + lVar1) - dVar2) *
                      *(double *)
                       ((long)local_248.p +
                       lVar24 * 8 + (lVar15 - local_248.begin.y) * local_248.jstride * 8 + lVar23) -
                     (dVar2 - *(double *)
                               ((long)local_188.p +
                               lVar24 * 8 + (~local_188.begin.y + iVar12) * lVar8 + lVar1)) *
                     *(double *)
                      ((long)local_248.p + lVar24 * 8 + lVar22 * local_248.jstride * 8 + lVar23)) *
                     local_108 +
                     *(double *)
                      ((long)local_148.p +
                      lVar24 * 8 +
                      lVar17 * local_148.jstride * 8 +
                      (lVar10 - local_148.begin.z) * local_148.kstride * 8 +
                      (long)local_148.begin.x * -8 + local_2a8) * local_318 * dVar2 +
                     ((*(double *)((long)local_188.p + lVar24 * 8 + lVar20 + lVar1 + 8) - dVar2) *
                      *(double *)((long)local_208.p + lVar24 * 8 + lVar16 + 8) -
                     (dVar2 - local_188.p
                              [local_188.jstride * lVar19 +
                               ((int)lVar10 - local_188.begin.z) * local_188.kstride +
                               local_188.nstride * local_300 +
                               (long)(((local_334.smallend.vect[0] + -1) - local_188.begin.x) +
                                     (int)lVar24)]) *
                     *(double *)((long)local_208.p + lVar24 * 8 + lVar16)) * local_f8;
                lVar24 = lVar24 + 1;
                lVar9 = lVar15;
              } while ((local_334.bigend.vect[0] - local_334.smallend.vect[0]) + 1 != (int)lVar24);
            }
          }
          local_45c = local_45c + 1;
          lVar10 = local_298;
        }
        local_308 = local_308 + 8;
      }
    }
    else {
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_d0,this_00,&mfi);
      for (uVar21 = 0; iVar7 = local_334.smallend.vect[2], uVar21 != local_310; uVar21 = uVar21 + 1)
      {
        while (iVar12 = iVar7, iVar12 <= local_334.bigend.vect[2]) {
          lVar8 = (long)iVar12;
          iVar7 = iVar12 + 1;
          lVar10 = (long)local_334.smallend.vect[1];
          while (lVar10 <= local_334.bigend.vect[1]) {
            if (local_334.bigend.vect[0] < local_334.smallend.vect[0]) {
              lVar10 = lVar10 + 1;
            }
            else {
              lVar11 = lVar10 - local_148.begin.y;
              lVar9 = (lVar10 - local_188.begin.y) * local_188.jstride;
              lVar18 = (lVar10 - local_208.begin.y) * local_208.jstride;
              lVar19 = (lVar8 - local_208.begin.z) * local_208.kstride;
              lVar1 = lVar10 + 1;
              lVar20 = (lVar8 - local_248.begin.z) * local_248.kstride;
              lVar15 = lVar10 - local_248.begin.y;
              iVar25 = (int)lVar10;
              lVar17 = (iVar12 - local_188.begin.z) * local_188.kstride;
              lVar26 = (lVar10 - local_1c8.begin.y) * local_1c8.jstride;
              lVar13 = (lVar8 - local_1c8.begin.z) * local_1c8.kstride;
              lVar22 = lVar10 - local_d0.begin.y;
              lVar14 = local_188.nstride * uVar21;
              lVar16 = (lVar10 - local_288.begin.y) * local_288.jstride;
              lVar23 = (long)local_334.smallend.vect[0];
              do {
                if (local_d0.p
                    [(lVar8 - local_d0.begin.z) * local_d0.kstride +
                     lVar22 * local_d0.jstride + (lVar23 - local_d0.begin.x)] == 0) {
                  local_1c8.p
                  [lVar26 + lVar13 + local_1c8.nstride * uVar21 + (lVar23 - local_1c8.begin.x)] =
                       0.0;
                }
                else {
                  lVar10 = lVar23 - local_188.begin.x;
                  dVar2 = local_188.p[lVar9 + lVar10 + lVar17 + lVar14];
                  local_1c8.p
                  [lVar26 + lVar13 + local_1c8.nstride * uVar21 + (lVar23 - local_1c8.begin.x)] =
                       ((local_188.p
                         [lVar9 + lVar10 + (iVar7 - local_188.begin.z) * local_188.kstride + lVar14]
                        - dVar2) *
                        local_288.p
                        [lVar16 + (lVar23 - local_288.begin.x) +
                                  (iVar7 - local_288.begin.z) * local_288.kstride +
                                  local_288.nstride * uVar21] -
                       (dVar2 - local_188.p
                                [lVar9 + lVar10 + (~local_188.begin.z + iVar12) * local_188.kstride
                                                  + lVar14]) *
                       local_288.p
                       [lVar16 + (lVar23 - local_288.begin.x) +
                                 (iVar12 - local_288.begin.z) * local_288.kstride +
                                 local_288.nstride * uVar21]) * local_e8 +
                       ((local_188.p
                         [(lVar1 - local_188.begin.y) * local_188.jstride + lVar17 + lVar14 + lVar10
                         ] - dVar2) *
                        local_248.p
                        [(lVar1 - local_248.begin.y) * local_248.jstride +
                         lVar20 + local_248.nstride * uVar21 + (lVar23 - local_248.begin.x)] -
                       (dVar2 - local_188.p
                                [(~local_188.begin.y + iVar25) * local_188.jstride +
                                 lVar17 + lVar14 + lVar10]) *
                       local_248.p
                       [lVar15 * local_248.jstride +
                        lVar20 + local_248.nstride * uVar21 + (lVar23 - local_248.begin.x)]) *
                       local_108 +
                       local_148.p
                       [lVar11 * local_148.jstride +
                        (lVar8 - local_148.begin.z) * local_148.kstride +
                        (lVar23 - local_148.begin.x)] * local_318 * dVar2 +
                       ((local_188.p
                         [lVar9 + lVar17 + lVar14 + ((lVar23 + 1) - (long)local_188.begin.x)] -
                        dVar2) * local_208.p
                                 [lVar18 + lVar19 + local_208.nstride * uVar21 +
                                                    ((lVar23 + 1) - (long)local_208.begin.x)] -
                       (dVar2 - local_188.p
                                [lVar9 + lVar17 + lVar14 + ((int)lVar23 + ~local_188.begin.x)]) *
                       local_208.p
                       [lVar18 + lVar19 + local_208.nstride * uVar21 + (lVar23 - local_208.begin.x)]
                       ) * local_f8;
                }
                lVar23 = lVar23 + 1;
                lVar10 = lVar1;
              } while (local_334.bigend.vect[0] + 1 != (int)lVar23);
            }
          }
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
MLABecLaplacian::Fapply (int amrlev, int mglev, MultiFab& out, const MultiFab& in) const
{
    BL_PROFILE("MLABecLaplacian::Fapply()");

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);

    const auto dxinv = m_geom[amrlev][mglev].InvCellSizeArray();

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;

    const int ncomp = getNComp();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && out.isFusingCandidate()) {
        const auto& xma = in.const_arrays();
        const auto& yma = out.arrays();
        const auto& ama = acoef.arrays();
        AMREX_D_TERM(const auto& bxma = bxcoef.const_arrays();,
                     const auto& byma = bycoef.const_arrays();,
                     const auto& bzma = bzcoef.const_arrays(););
        if (m_overset_mask[amrlev][mglev]) {
            const auto& osmma = m_overset_mask[amrlev][mglev]->const_arrays();
            ParallelFor(out, IntVect(0), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                mlabeclap_adotx_os(i,j,k,n, yma[box_no], xma[box_no], ama[box_no],
                                   AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                                   osmma[box_no], dxinv, ascalar, bscalar);
            });
        } else {
            ParallelFor(out, IntVect(0), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                mlabeclap_adotx(i,j,k,n, yma[box_no], xma[box_no], ama[box_no],
                                AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                                dxinv, ascalar, bscalar);
            });
        }
        Gpu::streamSynchronize();
    }